

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall Store::MEM_exe(Store *this,memory *MEM,uint *reg)

{
  int iVar1;
  
  iVar1 = this->func3;
  if (iVar1 == 2) {
    MEM->mem[this->address] = (uchar)this->rs_data2;
    MEM->mem[(long)this->address + 1] = *(uchar *)((long)&this->rs_data2 + 1);
    MEM->mem[(long)this->address + 2] = *(uchar *)((long)&this->rs_data2 + 2);
    MEM->mem[(long)this->address + 3] = *(uchar *)((long)&this->rs_data2 + 3);
  }
  else {
    if (iVar1 == 1) {
      MEM->mem[this->address] = (uchar)this->rs_data2;
      MEM->mem[(long)this->address + 1] = *(uchar *)((long)&this->rs_data2 + 1);
      return;
    }
    if (iVar1 == 0) {
      MEM->mem[this->address] = (uchar)this->rs_data2;
      return;
    }
  }
  return;
}

Assistant:

void Store::MEM_exe(memory &MEM,unsigned int *reg) {
    switch(func3){
        case 0:{
            MEM.mem[address]=rs_data2%256;
            break;
        }
        case 1:{
            MEM.mem[address]=rs_data2%256;
            MEM.mem[address+1]=(rs_data2>>8)%256;
            break;
        }
        case 2:{
            MEM.mem[address]=rs_data2%256;
            MEM.mem[address+1]=(rs_data2>>8)%256;
            MEM.mem[address+2]=(rs_data2>>16)%256;
            MEM.mem[address+3]=(rs_data2>>24)%256;
            break;
        }
    }
}